

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

void mtree_entry_register_free(mtree_writer *mtree)

{
  mtree_entry_conflict *pmVar1;
  mtree_entry_conflict *file_next;
  mtree_entry_conflict *file;
  mtree_writer *mtree_local;
  
  file_next = (mtree->file_list).first;
  while (file_next != (mtree_entry_conflict *)0x0) {
    pmVar1 = file_next->next;
    mtree_entry_free(file_next);
    file_next = pmVar1;
  }
  return;
}

Assistant:

static void
mtree_entry_register_free(struct mtree_writer *mtree)
{
	struct mtree_entry *file, *file_next;

	file = mtree->file_list.first;
	while (file != NULL) {
		file_next = file->next;
		mtree_entry_free(file);
		file = file_next;
	}
}